

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void Imf_3_3::anon_unknown_6::writePixelData
               (OutputStreamMutex *filedata,Data *partdata,LineBuffer *lineBuffer)

{
  Data *in_stack_00000018;
  OutputStreamMutex *in_stack_00000020;
  
  writePixelData(in_stack_00000020,in_stack_00000018,filedata._4_4_,(char *)partdata,
                 lineBuffer._4_4_);
  return;
}

Assistant:

inline void
writePixelData (
    OutputStreamMutex* filedata,
    OutputFile::Data*  partdata,
    const LineBuffer*  lineBuffer)
{
    writePixelData (
        filedata,
        partdata,
        lineBuffer->minY,
        lineBuffer->dataPtr,
        lineBuffer->dataSize);
}